

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::updateCurrentPage(QCalendarWidgetPrivate *this,QDate date)

{
  undefined8 uVar1;
  int year;
  int month;
  long lVar2;
  long lVar3;
  QItemSelectionModel *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_70 [24];
  int col;
  int row;
  long local_50;
  long local_48;
  QDate local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&this->m_model->m_calendar;
  lVar3 = *(long *)(*(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 8) + 600);
  local_48 = *(long *)(lVar3 + 0x28);
  lVar3 = *(long *)(lVar3 + 0x30);
  local_50 = lVar3;
  local_40.jd = date.jd;
  if (local_48 + 0xb69eeff91fU < 0x16d3e147974) {
    lVar2 = QDate::daysTo((QDate)&local_48);
    if (lVar2 < 0) {
      local_40.jd = local_48;
    }
  }
  if (lVar3 + 0xb69eeff91fU < 0x16d3e147974) {
    lVar3 = QDate::daysTo((QDate)&local_50);
    if (0 < lVar3) {
      local_40.jd = local_50;
    }
  }
  year = QDate::year(&local_40,uVar1);
  month = QDate::month(&local_40,uVar1);
  showMonth(this,year,month);
  row = -1;
  col = -1;
  QtPrivate::QCalendarModel::cellForDate(this->m_model,local_40,&row,&col);
  if ((row != -1) && (col != -1)) {
    pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)this->m_view);
    (**(code **)(*(long *)this->m_model + 0x60))(local_70,this->m_model,row,col);
    (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,local_70,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateCurrentPage(QDate date)
{
    Q_Q(QCalendarWidget);
    QCalendar cal = m_model->calendar();

    QDate newDate = date;
    QDate minDate = q->minimumDate();
    QDate maxDate = q->maximumDate();
    if (minDate.isValid()&& minDate.daysTo(newDate) < 0)
        newDate = minDate;
    if (maxDate.isValid()&& maxDate.daysTo(newDate) > 0)
        newDate = maxDate;
    showMonth(newDate.year(cal), newDate.month(cal));
    int row = -1, col = -1;
    m_model->cellForDate(newDate, &row, &col);
    if (row != -1 && col != -1)
    {
        m_view->selectionModel()->setCurrentIndex(m_model->index(row, col),
                                                  QItemSelectionModel::NoUpdate);
    }
}